

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,1,1,false>,Eigen::internal::assign_op<double,double>>
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *dst,
               Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *src,
               assign_op<double,_double> *func)

{
  Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *in_RDI;
  ActualDstType actualDst;
  Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *in_stack_ffffffffffffffd8;
  
  Assignment<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(in_RDI,in_stack_ffffffffffffffd8,(assign_op<double,_double> *)0x1ebfa1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);
  
  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);
  
  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}